

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  rnnvalue **pprVar4;
  rnnvalue *prVar5;
  rnnbitfield **pprVar6;
  rnnbitfield *prVar7;
  int iVar8;
  long lVar9;
  
  pcVar3 = src->name;
  dst->name = pcVar3;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strdup(pcVar3);
    dst->name = pcVar3;
  }
  iVar8 = src->add;
  dst->shr = src->shr;
  dst->add = iVar8;
  uVar2 = src->max;
  dst->min = src->min;
  dst->max = uVar2;
  dst->align = src->align;
  if (0 < src->valsnum) {
    iVar8 = dst->valsnum;
    lVar9 = 0;
    do {
      iVar1 = dst->valsmax;
      if (iVar1 <= iVar8) {
        iVar8 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar8 = 0x10;
        }
        dst->valsmax = iVar8;
        pprVar4 = (rnnvalue **)realloc(dst->vals,(long)iVar8 << 3);
        dst->vals = pprVar4;
      }
      prVar5 = copyvalue(src->vals[lVar9],file);
      iVar1 = dst->valsnum;
      iVar8 = iVar1 + 1;
      dst->valsnum = iVar8;
      dst->vals[iVar1] = prVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < src->valsnum);
  }
  if (0 < src->bitfieldsnum) {
    iVar8 = dst->bitfieldsnum;
    lVar9 = 0;
    do {
      iVar1 = dst->bitfieldsmax;
      if (iVar1 <= iVar8) {
        iVar8 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar8 = 0x10;
        }
        dst->bitfieldsmax = iVar8;
        pprVar6 = (rnnbitfield **)realloc(dst->bitfields,(long)iVar8 << 3);
        dst->bitfields = pprVar6;
      }
      prVar7 = copybitfield(src->bitfields[lVar9],file);
      iVar1 = dst->bitfieldsnum;
      iVar8 = iVar1 + 1;
      dst->bitfieldsnum = iVar8;
      dst->bitfields[iVar1] = prVar7;
      lVar9 = lVar9 + 1;
    } while (lVar9 < src->bitfieldsnum);
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	if (dst->name)
		dst->name = strdup(dst->name);
	dst->shr = src->shr;
	dst->add = src->add;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}